

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O3

void aom_lowbd_blend_a64_d16_mask_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint8_t *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  uVar2 = (ulong)src0_stride;
  iVar5 = conv_params->round_1 + conv_params->round_0;
  cVar4 = (char)iVar5;
  iVar6 = (-1 << (0xdU - cVar4 & 0x1f)) +
          (1 << (0x15U - cVar4 & 0x1f)) + (1 << (0x16U - cVar4 & 0x1f));
  uVar3 = 0x14 - iVar5;
  iVar5 = iVar6 * 0x40;
  auVar15._4_4_ = iVar5;
  auVar15._0_4_ = iVar5;
  auVar15._8_4_ = iVar5;
  auVar15._12_4_ = iVar5;
  auVar14._4_4_ = iVar6;
  auVar14._0_4_ = iVar6;
  auVar14._8_4_ = iVar6;
  auVar14._12_4_ = iVar6;
  auVar14._16_4_ = iVar6;
  auVar14._20_4_ = iVar6;
  auVar14._24_4_ = iVar6;
  auVar14._28_4_ = iVar6;
  auVar14 = vpslld_avx2(auVar14,6);
  if (subh == 0 && subw == 0) {
    if (w == 0x10) {
      if (0 < h) {
        auVar16._8_2_ = 0x40;
        auVar16._0_8_ = 0x40004000400040;
        auVar16._10_2_ = 0x40;
        auVar16._12_2_ = 0x40;
        auVar16._14_2_ = 0x40;
        auVar16._16_2_ = 0x40;
        auVar16._18_2_ = 0x40;
        auVar16._20_2_ = 0x40;
        auVar16._22_2_ = 0x40;
        auVar16._24_2_ = 0x40;
        auVar16._26_2_ = 0x40;
        auVar16._28_2_ = 0x40;
        auVar16._30_2_ = 0x40;
        do {
          auVar27 = vpmovzxbw_avx2(*(undefined1 (*) [16])mask);
          auVar43 = vpsubw_avx2(auVar16,auVar27);
          auVar17 = vpunpcklwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar44 = vpunpcklwd_avx2(auVar27,auVar43);
          auVar17 = vpmaddwd_avx2(auVar44,auVar17);
          auVar44 = vpunpckhwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar27 = vpunpckhwd_avx2(auVar27,auVar43);
          auVar27 = vpmaddwd_avx2(auVar44,auVar27);
          auVar17 = vpsubd_avx2(auVar17,auVar14);
          auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
          auVar27 = vpsubd_avx2(auVar27,auVar14);
          auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
          auVar17 = vpackssdw_avx2(auVar17,auVar27);
          auVar15 = vpackuswb_avx(auVar17._0_16_,auVar17._16_16_);
          *(undefined1 (*) [16])dst = auVar15;
          mask = *(undefined1 (*) [16])mask + mask_stride;
          dst = *(undefined1 (*) [16])dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 8) {
      if (0 < h) {
        auVar11._8_2_ = 0x40;
        auVar11._0_8_ = 0x40004000400040;
        auVar11._10_2_ = 0x40;
        auVar11._12_2_ = 0x40;
        auVar11._14_2_ = 0x40;
        do {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)mask;
          auVar38 = vpmovzxbw_avx(auVar1);
          auVar41 = vpsubw_avx(auVar11,auVar38);
          auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar46 = vpunpcklwd_avx(auVar38,auVar41);
          auVar1 = vpmaddwd_avx(auVar46,auVar1);
          auVar46 = vpunpckhwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar41 = vpunpckhwd_avx(auVar38,auVar41);
          auVar1 = vpsubd_avx(auVar1,auVar15);
          auVar38 = vpsrad_avx(auVar1,ZEXT416(uVar3));
          auVar1 = vpmaddwd_avx(auVar46,auVar41);
          auVar1 = vpsubd_avx(auVar1,auVar15);
          auVar1 = vpsrad_avx(auVar1,ZEXT416(uVar3));
          auVar1 = vpackssdw_avx(auVar38,auVar1);
          auVar1 = vpackuswb_avx(auVar1,auVar1);
          *(long *)dst = auVar1._0_8_;
          mask = (uint8_t *)((long)mask + (ulong)mask_stride);
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      if (0 < h) {
        auVar38._8_2_ = 0x40;
        auVar38._0_8_ = 0x40004000400040;
        auVar38._10_2_ = 0x40;
        auVar38._12_2_ = 0x40;
        auVar38._14_2_ = 0x40;
        do {
          auVar11 = vpmovzxbw_avx(ZEXT416(*(uint *)mask));
          auVar1 = vpsubw_avx(auVar38,auVar11);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)src0;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)src1;
          auVar41 = vpunpcklwd_avx(auVar41,auVar46);
          auVar11 = vpunpcklwd_avx(auVar11,auVar1);
          auVar11 = vpmaddwd_avx(auVar41,auVar11);
          auVar11 = vpsubd_avx(auVar11,auVar15);
          auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpackssdw_avx(auVar11,auVar11);
          auVar11 = vpackuswb_avx(auVar11,auVar11);
          *(int *)dst = auVar11._0_4_;
          mask = (uint8_t *)((long)mask + (ulong)mask_stride);
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)((long)src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)((long)src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (0 < h) {
      iVar5 = 0;
      auVar17._8_2_ = 0x40;
      auVar17._0_8_ = 0x40004000400040;
      auVar17._10_2_ = 0x40;
      auVar17._12_2_ = 0x40;
      auVar17._14_2_ = 0x40;
      auVar17._16_2_ = 0x40;
      auVar17._18_2_ = 0x40;
      auVar17._20_2_ = 0x40;
      auVar17._22_2_ = 0x40;
      auVar17._24_2_ = 0x40;
      auVar17._26_2_ = 0x40;
      auVar17._28_2_ = 0x40;
      auVar17._30_2_ = 0x40;
      do {
        if (0 < w) {
          lVar7 = 0;
          do {
            auVar27 = vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar7));
            auVar44 = vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar7 + 0x10));
            auVar43 = vpsubw_avx2(auVar17,auVar27);
            auVar48 = vpsubw_avx2(auVar17,auVar44);
            auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                      *(undefined1 (*) [32])(src1 + lVar7));
            auVar20 = vpunpcklwd_avx2(auVar27,auVar43);
            auVar16 = vpmaddwd_avx2(auVar16,auVar20);
            auVar20 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                      *(undefined1 (*) [32])(src1 + lVar7));
            auVar27 = vpunpckhwd_avx2(auVar27,auVar43);
            auVar27 = vpmaddwd_avx2(auVar20,auVar27);
            auVar43 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                      *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
            auVar20 = vpunpcklwd_avx2(auVar44,auVar48);
            auVar43 = vpmaddwd_avx2(auVar43,auVar20);
            auVar20 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                      *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
            auVar44 = vpunpckhwd_avx2(auVar44,auVar48);
            auVar44 = vpmaddwd_avx2(auVar20,auVar44);
            auVar16 = vpsubd_avx2(auVar16,auVar14);
            auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
            auVar27 = vpsubd_avx2(auVar27,auVar14);
            auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
            auVar16 = vpackssdw_avx2(auVar16,auVar27);
            auVar27 = vpsubd_avx2(auVar43,auVar14);
            auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
            auVar43 = vpsubd_avx2(auVar44,auVar14);
            auVar43 = vpsrad_avx2(auVar43,ZEXT416(uVar3));
            auVar27 = vpackssdw_avx2(auVar27,auVar43);
            auVar16 = vpackuswb_avx2(auVar16,auVar27);
            auVar16 = vpermq_avx2(auVar16,0xd8);
            *(undefined1 (*) [32])(dst + lVar7) = auVar16;
            lVar7 = lVar7 + 0x20;
          } while (lVar7 < w);
        }
        mask = mask + mask_stride;
        dst = dst + dst_stride;
        iVar5 = iVar5 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar2;
      } while (iVar5 != h);
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (w == 0x10) {
      if (0 < h) {
        auVar18[8] = 1;
        auVar18._0_8_ = 0x101010101010101;
        auVar18[9] = 1;
        auVar18[10] = 1;
        auVar18[0xb] = 1;
        auVar18[0xc] = 1;
        auVar18[0xd] = 1;
        auVar18[0xe] = 1;
        auVar18[0xf] = 1;
        auVar18[0x10] = 1;
        auVar18[0x11] = 1;
        auVar18[0x12] = 1;
        auVar18[0x13] = 1;
        auVar18[0x14] = 1;
        auVar18[0x15] = 1;
        auVar18[0x16] = 1;
        auVar18[0x17] = 1;
        auVar18[0x18] = 1;
        auVar18[0x19] = 1;
        auVar18[0x1a] = 1;
        auVar18[0x1b] = 1;
        auVar18[0x1c] = 1;
        auVar18[0x1d] = 1;
        auVar18[0x1e] = 1;
        auVar18[0x1f] = 1;
        auVar25._8_2_ = 2;
        auVar25._0_8_ = 0x2000200020002;
        auVar25._10_2_ = 2;
        auVar25._12_2_ = 2;
        auVar25._14_2_ = 2;
        auVar25._16_2_ = 2;
        auVar25._18_2_ = 2;
        auVar25._20_2_ = 2;
        auVar25._22_2_ = 2;
        auVar25._24_2_ = 2;
        auVar25._26_2_ = 2;
        auVar25._28_2_ = 2;
        auVar25._30_2_ = 2;
        auVar32._8_2_ = 0x40;
        auVar32._0_8_ = 0x40004000400040;
        auVar32._10_2_ = 0x40;
        auVar32._12_2_ = 0x40;
        auVar32._14_2_ = 0x40;
        auVar32._16_2_ = 0x40;
        auVar32._18_2_ = 0x40;
        auVar32._20_2_ = 0x40;
        auVar32._22_2_ = 0x40;
        auVar32._24_2_ = 0x40;
        auVar32._26_2_ = 0x40;
        auVar32._28_2_ = 0x40;
        auVar32._30_2_ = 0x40;
        do {
          auVar16 = vpaddusb_avx2(*(undefined1 (*) [32])mask,
                                  *(undefined1 (*) [32])(*(undefined1 (*) [32])mask + mask_stride));
          auVar16 = vpmaddubsw_avx2(auVar16,auVar18);
          auVar16 = vpaddw_avx2(auVar16,auVar25);
          auVar43 = vpsrlw_avx2(auVar16,2);
          auVar17 = vpsubw_avx2(auVar32,auVar43);
          auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar27 = vpunpcklwd_avx2(auVar43,auVar17);
          auVar16 = vpmaddwd_avx2(auVar16,auVar27);
          auVar27 = vpunpckhwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar17 = vpunpckhwd_avx2(auVar43,auVar17);
          auVar17 = vpmaddwd_avx2(auVar27,auVar17);
          auVar16 = vpsubd_avx2(auVar16,auVar14);
          auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
          auVar17 = vpsubd_avx2(auVar17,auVar14);
          auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
          auVar16 = vpackssdw_avx2(auVar16,auVar17);
          auVar15 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
          *(undefined1 (*) [16])dst = auVar15;
          mask = *(undefined1 (*) [32])mask + mask_stride * 2;
          dst = *(undefined1 (*) [16])dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 8) {
      if (0 < h) {
        auVar12[8] = 1;
        auVar12._0_8_ = 0x101010101010101;
        auVar12[9] = 1;
        auVar12[10] = 1;
        auVar12[0xb] = 1;
        auVar12[0xc] = 1;
        auVar12[0xd] = 1;
        auVar12[0xe] = 1;
        auVar12[0xf] = 1;
        auVar23._8_2_ = 2;
        auVar23._0_8_ = 0x2000200020002;
        auVar23._10_2_ = 2;
        auVar23._12_2_ = 2;
        auVar23._14_2_ = 2;
        auVar30._8_2_ = 0x40;
        auVar30._0_8_ = 0x40004000400040;
        auVar30._10_2_ = 0x40;
        auVar30._12_2_ = 0x40;
        auVar30._14_2_ = 0x40;
        do {
          auVar11 = vpaddusb_avx(*(undefined1 (*) [16])mask,
                                 *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride));
          auVar11 = vpmaddubsw_avx(auVar11,auVar12);
          auVar11 = vpaddw_avx(auVar11,auVar23);
          auVar41 = vpsrlw_avx(auVar11,2);
          auVar1 = vpsubw_avx(auVar30,auVar41);
          auVar11 = vpunpcklwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar38 = vpunpcklwd_avx(auVar41,auVar1);
          auVar11 = vpmaddwd_avx(auVar11,auVar38);
          auVar38 = vpunpckhwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar41 = vpunpckhwd_avx(auVar41,auVar1);
          auVar11 = vpsubd_avx(auVar11,auVar15);
          auVar1 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpmaddwd_avx(auVar38,auVar41);
          auVar11 = vpsubd_avx(auVar11,auVar15);
          auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpackssdw_avx(auVar1,auVar11);
          auVar11 = vpackuswb_avx(auVar11,auVar11);
          *(long *)dst = auVar11._0_8_;
          mask = *(undefined1 (*) [16])mask + mask_stride * 2;
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      if (0 < h) {
        auVar9[8] = 1;
        auVar9._0_8_ = 0x101010101010101;
        auVar9[9] = 1;
        auVar9[10] = 1;
        auVar9[0xb] = 1;
        auVar9[0xc] = 1;
        auVar9[0xd] = 1;
        auVar9[0xe] = 1;
        auVar9[0xf] = 1;
        auVar21._8_2_ = 2;
        auVar21._0_8_ = 0x2000200020002;
        auVar21._10_2_ = 2;
        auVar21._12_2_ = 2;
        auVar21._14_2_ = 2;
        auVar28._8_2_ = 0x40;
        auVar28._0_8_ = 0x40004000400040;
        auVar28._10_2_ = 0x40;
        auVar28._12_2_ = 0x40;
        auVar28._14_2_ = 0x40;
        do {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)mask;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
          auVar11 = vpaddusb_avx(auVar37,auVar45);
          auVar11 = vpmaddubsw_avx(auVar11,auVar9);
          auVar11 = vpaddw_avx(auVar11,auVar21);
          auVar38 = vpsrlw_avx(auVar11,2);
          auVar11 = vpsubw_avx(auVar28,auVar38);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)src0;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)src1;
          auVar1 = vpunpcklwd_avx(auVar49,auVar52);
          auVar11 = vpunpcklwd_avx(auVar38,auVar11);
          auVar11 = vpmaddwd_avx(auVar1,auVar11);
          auVar11 = vpsubd_avx(auVar11,auVar15);
          auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpackssdw_avx(auVar11,auVar11);
          auVar11 = vpackuswb_avx(auVar11,auVar11);
          *(int *)dst = auVar11._0_4_;
          mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)((long)src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)((long)src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (0 < h) {
      puVar8 = mask + (ulong)mask_stride + 0x20;
      auVar19[8] = 1;
      auVar19._0_8_ = 0x101010101010101;
      auVar19[9] = 1;
      auVar19[10] = 1;
      auVar19[0xb] = 1;
      auVar19[0xc] = 1;
      auVar19[0xd] = 1;
      auVar19[0xe] = 1;
      auVar19[0xf] = 1;
      auVar19[0x10] = 1;
      auVar19[0x11] = 1;
      auVar19[0x12] = 1;
      auVar19[0x13] = 1;
      auVar19[0x14] = 1;
      auVar19[0x15] = 1;
      auVar19[0x16] = 1;
      auVar19[0x17] = 1;
      auVar19[0x18] = 1;
      auVar19[0x19] = 1;
      auVar19[0x1a] = 1;
      auVar19[0x1b] = 1;
      auVar19[0x1c] = 1;
      auVar19[0x1d] = 1;
      auVar19[0x1e] = 1;
      auVar19[0x1f] = 1;
      auVar26._8_2_ = 2;
      auVar26._0_8_ = 0x2000200020002;
      auVar26._10_2_ = 2;
      auVar26._12_2_ = 2;
      auVar26._14_2_ = 2;
      auVar26._16_2_ = 2;
      auVar26._18_2_ = 2;
      auVar26._20_2_ = 2;
      auVar26._22_2_ = 2;
      auVar26._24_2_ = 2;
      auVar26._26_2_ = 2;
      auVar26._28_2_ = 2;
      auVar26._30_2_ = 2;
      iVar5 = 0;
      auVar33._8_2_ = 0x40;
      auVar33._0_8_ = 0x40004000400040;
      auVar33._10_2_ = 0x40;
      auVar33._12_2_ = 0x40;
      auVar33._14_2_ = 0x40;
      auVar33._16_2_ = 0x40;
      auVar33._18_2_ = 0x40;
      auVar33._20_2_ = 0x40;
      auVar33._22_2_ = 0x40;
      auVar33._24_2_ = 0x40;
      auVar33._26_2_ = 0x40;
      auVar33._28_2_ = 0x40;
      auVar33._30_2_ = 0x40;
      do {
        if (0 < w) {
          lVar7 = 0;
          do {
            auVar16 = vpaddusb_avx2(*(undefined1 (*) [32])(mask + lVar7 * 2),
                                    *(undefined1 (*) [32])(puVar8 + lVar7 * 2 + -0x20));
            auVar17 = vpaddusb_avx2(*(undefined1 (*) [32])(mask + lVar7 * 2 + 0x20),
                                    *(undefined1 (*) [32])(puVar8 + lVar7 * 2));
            auVar16 = vpmaddubsw_avx2(auVar16,auVar19);
            auVar17 = vpmaddubsw_avx2(auVar17,auVar19);
            auVar16 = vpaddw_avx2(auVar16,auVar26);
            auVar44 = vpsrlw_avx2(auVar16,2);
            auVar16 = vpaddw_avx2(auVar17,auVar26);
            auVar48 = vpsrlw_avx2(auVar16,2);
            auVar17 = vpsubw_avx2(auVar33,auVar44);
            auVar43 = vpsubw_avx2(auVar33,auVar48);
            auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                      *(undefined1 (*) [32])(src1 + lVar7));
            auVar27 = vpunpcklwd_avx2(auVar44,auVar17);
            auVar16 = vpmaddwd_avx2(auVar16,auVar27);
            auVar27 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                      *(undefined1 (*) [32])(src1 + lVar7));
            auVar17 = vpunpckhwd_avx2(auVar44,auVar17);
            auVar17 = vpmaddwd_avx2(auVar27,auVar17);
            auVar27 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                      *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
            auVar44 = vpunpcklwd_avx2(auVar48,auVar43);
            auVar27 = vpmaddwd_avx2(auVar44,auVar27);
            auVar44 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                      *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
            auVar43 = vpunpckhwd_avx2(auVar48,auVar43);
            auVar43 = vpmaddwd_avx2(auVar44,auVar43);
            auVar16 = vpsubd_avx2(auVar16,auVar14);
            auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
            auVar17 = vpsubd_avx2(auVar17,auVar14);
            auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
            auVar16 = vpackssdw_avx2(auVar16,auVar17);
            auVar17 = vpsubd_avx2(auVar27,auVar14);
            auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
            auVar27 = vpsubd_avx2(auVar43,auVar14);
            auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
            auVar17 = vpackssdw_avx2(auVar17,auVar27);
            auVar16 = vpackuswb_avx2(auVar16,auVar17);
            auVar16 = vpermq_avx2(auVar16,0xd8);
            *(undefined1 (*) [32])(dst + lVar7) = auVar16;
            lVar7 = lVar7 + 0x20;
          } while (lVar7 < w);
        }
        mask = mask + mask_stride * 2;
        dst = dst + dst_stride;
        iVar5 = iVar5 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar2;
        puVar8 = puVar8 + mask_stride * 2;
      } while (iVar5 != h);
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (w == 0x10) {
      if (0 < h) {
        auVar44[8] = 1;
        auVar44._0_8_ = 0x101010101010101;
        auVar44[9] = 1;
        auVar44[10] = 1;
        auVar44[0xb] = 1;
        auVar44[0xc] = 1;
        auVar44[0xd] = 1;
        auVar44[0xe] = 1;
        auVar44[0xf] = 1;
        auVar44[0x10] = 1;
        auVar44[0x11] = 1;
        auVar44[0x12] = 1;
        auVar44[0x13] = 1;
        auVar44[0x14] = 1;
        auVar44[0x15] = 1;
        auVar44[0x16] = 1;
        auVar44[0x17] = 1;
        auVar44[0x18] = 1;
        auVar44[0x19] = 1;
        auVar44[0x1a] = 1;
        auVar44[0x1b] = 1;
        auVar44[0x1c] = 1;
        auVar44[0x1d] = 1;
        auVar44[0x1e] = 1;
        auVar44[0x1f] = 1;
        auVar48._8_2_ = 0x40;
        auVar48._0_8_ = 0x40004000400040;
        auVar48._10_2_ = 0x40;
        auVar48._12_2_ = 0x40;
        auVar48._14_2_ = 0x40;
        auVar48._16_2_ = 0x40;
        auVar48._18_2_ = 0x40;
        auVar48._20_2_ = 0x40;
        auVar48._22_2_ = 0x40;
        auVar48._24_2_ = 0x40;
        auVar48._26_2_ = 0x40;
        auVar48._28_2_ = 0x40;
        auVar48._30_2_ = 0x40;
        do {
          auVar16 = vpmaddubsw_avx2(*(undefined1 (*) [32])mask,auVar44);
          auVar16 = vpavgw_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar27 = vpsubw_avx2(auVar48,auVar16);
          auVar17 = vpunpcklwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar43 = vpunpcklwd_avx2(auVar16,auVar27);
          auVar17 = vpmaddwd_avx2(auVar17,auVar43);
          auVar43 = vpunpckhwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar16 = vpunpckhwd_avx2(auVar16,auVar27);
          auVar16 = vpmaddwd_avx2(auVar43,auVar16);
          auVar17 = vpsubd_avx2(auVar17,auVar14);
          auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
          auVar16 = vpsubd_avx2(auVar16,auVar14);
          auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
          auVar16 = vpackssdw_avx2(auVar17,auVar16);
          auVar15 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
          *(undefined1 (*) [16])dst = auVar15;
          mask = *(undefined1 (*) [32])mask + mask_stride;
          dst = *(undefined1 (*) [16])dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 8) {
      if (0 < h) {
        auVar13[8] = 1;
        auVar13._0_8_ = 0x101010101010101;
        auVar13[9] = 1;
        auVar13[10] = 1;
        auVar13[0xb] = 1;
        auVar13[0xc] = 1;
        auVar13[0xd] = 1;
        auVar13[0xe] = 1;
        auVar13[0xf] = 1;
        auVar31._8_2_ = 0x40;
        auVar31._0_8_ = 0x40004000400040;
        auVar31._10_2_ = 0x40;
        auVar31._12_2_ = 0x40;
        auVar31._14_2_ = 0x40;
        do {
          auVar11 = vpmaddubsw_avx(*(undefined1 (*) [16])mask,auVar13);
          auVar11 = vpavgw_avx(auVar11,(undefined1  [16])0x0);
          auVar38 = vpsubw_avx(auVar31,auVar11);
          auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar41 = vpunpcklwd_avx(auVar11,auVar38);
          auVar1 = vpmaddwd_avx(auVar1,auVar41);
          auVar41 = vpunpckhwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar38 = vpunpckhwd_avx(auVar11,auVar38);
          auVar11 = vpsubd_avx(auVar1,auVar15);
          auVar1 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpmaddwd_avx(auVar41,auVar38);
          auVar11 = vpsubd_avx(auVar11,auVar15);
          auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpackssdw_avx(auVar1,auVar11);
          auVar11 = vpackuswb_avx(auVar11,auVar11);
          *(long *)dst = auVar11._0_8_;
          mask = *(undefined1 (*) [16])mask + mask_stride;
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      if (0 < h) {
        auVar10[8] = 1;
        auVar10._0_8_ = 0x101010101010101;
        auVar10[9] = 1;
        auVar10[10] = 1;
        auVar10[0xb] = 1;
        auVar10[0xc] = 1;
        auVar10[0xd] = 1;
        auVar10[0xe] = 1;
        auVar10[0xf] = 1;
        auVar29._8_2_ = 0x40;
        auVar29._0_8_ = 0x40004000400040;
        auVar29._10_2_ = 0x40;
        auVar29._12_2_ = 0x40;
        auVar29._14_2_ = 0x40;
        do {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)mask;
          auVar11 = vpmaddubsw_avx(auVar39,auVar10);
          auVar11 = vpavgw_avx(auVar11,(undefined1  [16])0x0);
          auVar1 = vpsubw_avx(auVar29,auVar11);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)src0;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)src1;
          auVar38 = vpunpcklwd_avx(auVar50,auVar53);
          auVar11 = vpunpcklwd_avx(auVar11,auVar1);
          auVar11 = vpmaddwd_avx(auVar38,auVar11);
          auVar11 = vpsubd_avx(auVar11,auVar15);
          auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
          auVar11 = vpackssdw_avx(auVar11,auVar11);
          auVar11 = vpackuswb_avx(auVar11,auVar11);
          *(int *)dst = auVar11._0_4_;
          mask = (uint8_t *)((long)mask + (ulong)mask_stride);
          dst = dst + dst_stride;
          src0 = (CONV_BUF_TYPE *)((long)src0 + uVar2 * 2);
          src1 = (CONV_BUF_TYPE *)((long)src1 + (ulong)src1_stride * 2);
          h = h + -1;
        } while (h != 0);
      }
    }
    else if (0 < h) {
      iVar5 = 0;
      auVar20[8] = 1;
      auVar20._0_8_ = 0x101010101010101;
      auVar20[9] = 1;
      auVar20[10] = 1;
      auVar20[0xb] = 1;
      auVar20[0xc] = 1;
      auVar20[0xd] = 1;
      auVar20[0xe] = 1;
      auVar20[0xf] = 1;
      auVar20[0x10] = 1;
      auVar20[0x11] = 1;
      auVar20[0x12] = 1;
      auVar20[0x13] = 1;
      auVar20[0x14] = 1;
      auVar20[0x15] = 1;
      auVar20[0x16] = 1;
      auVar20[0x17] = 1;
      auVar20[0x18] = 1;
      auVar20[0x19] = 1;
      auVar20[0x1a] = 1;
      auVar20[0x1b] = 1;
      auVar20[0x1c] = 1;
      auVar20[0x1d] = 1;
      auVar20[0x1e] = 1;
      auVar20[0x1f] = 1;
      auVar34._8_2_ = 0x40;
      auVar34._0_8_ = 0x40004000400040;
      auVar34._10_2_ = 0x40;
      auVar34._12_2_ = 0x40;
      auVar34._14_2_ = 0x40;
      auVar34._16_2_ = 0x40;
      auVar34._18_2_ = 0x40;
      auVar34._20_2_ = 0x40;
      auVar34._22_2_ = 0x40;
      auVar34._24_2_ = 0x40;
      auVar34._26_2_ = 0x40;
      auVar34._28_2_ = 0x40;
      auVar34._30_2_ = 0x40;
      do {
        if (0 < w) {
          lVar7 = 0;
          do {
            auVar16 = vpmaddubsw_avx2(*(undefined1 (*) [32])(mask + lVar7 * 2),auVar20);
            auVar17 = vpmaddubsw_avx2(*(undefined1 (*) [32])(mask + lVar7 * 2 + 0x20),auVar20);
            auVar16 = vpavgw_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar17 = vpavgw_avx2(auVar17,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar43 = vpsubw_avx2(auVar34,auVar16);
            auVar44 = vpsubw_avx2(auVar34,auVar17);
            auVar27 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                      *(undefined1 (*) [32])(src1 + lVar7));
            auVar48 = vpunpcklwd_avx2(auVar16,auVar43);
            auVar27 = vpmaddwd_avx2(auVar27,auVar48);
            auVar48 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                      *(undefined1 (*) [32])(src1 + lVar7));
            auVar16 = vpunpckhwd_avx2(auVar16,auVar43);
            auVar16 = vpmaddwd_avx2(auVar48,auVar16);
            auVar43 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                      *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
            auVar48 = vpunpcklwd_avx2(auVar17,auVar44);
            auVar43 = vpmaddwd_avx2(auVar48,auVar43);
            auVar48 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                      *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
            auVar17 = vpunpckhwd_avx2(auVar17,auVar44);
            auVar17 = vpmaddwd_avx2(auVar48,auVar17);
            auVar27 = vpsubd_avx2(auVar27,auVar14);
            auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
            auVar16 = vpsubd_avx2(auVar16,auVar14);
            auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
            auVar16 = vpackssdw_avx2(auVar27,auVar16);
            auVar27 = vpsubd_avx2(auVar43,auVar14);
            auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
            auVar17 = vpsubd_avx2(auVar17,auVar14);
            auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
            auVar17 = vpackssdw_avx2(auVar27,auVar17);
            auVar16 = vpackuswb_avx2(auVar16,auVar17);
            auVar16 = vpermq_avx2(auVar16,0xd8);
            *(undefined1 (*) [32])(dst + lVar7) = auVar16;
            lVar7 = lVar7 + 0x20;
          } while (lVar7 < w);
        }
        mask = mask + mask_stride;
        dst = dst + dst_stride;
        iVar5 = iVar5 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + uVar2;
      } while (iVar5 != h);
    }
  }
  else if (w == 0x10) {
    if (0 < h) {
      auVar27._8_2_ = 0x40;
      auVar27._0_8_ = 0x40004000400040;
      auVar27._10_2_ = 0x40;
      auVar27._12_2_ = 0x40;
      auVar27._14_2_ = 0x40;
      auVar27._16_2_ = 0x40;
      auVar27._18_2_ = 0x40;
      auVar27._20_2_ = 0x40;
      auVar27._22_2_ = 0x40;
      auVar27._24_2_ = 0x40;
      auVar27._26_2_ = 0x40;
      auVar27._28_2_ = 0x40;
      auVar27._30_2_ = 0x40;
      do {
        auVar15 = vpaddusb_avx(*(undefined1 (*) [16])mask,
                               *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride));
        auVar15 = vpavgb_avx(auVar15,(undefined1  [16])0x0);
        auVar17 = vpmovzxbw_avx2(auVar15);
        auVar43 = vpsubw_avx2(auVar27,auVar17);
        auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
        auVar44 = vpunpcklwd_avx2(auVar17,auVar43);
        auVar16 = vpmaddwd_avx2(auVar16,auVar44);
        auVar44 = vpunpckhwd_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
        auVar17 = vpunpckhwd_avx2(auVar17,auVar43);
        auVar17 = vpmaddwd_avx2(auVar44,auVar17);
        auVar16 = vpsubd_avx2(auVar16,auVar14);
        auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
        auVar17 = vpsubd_avx2(auVar17,auVar14);
        auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
        auVar16 = vpackssdw_avx2(auVar16,auVar17);
        auVar15 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
        *(undefined1 (*) [16])dst = auVar15;
        mask = *(undefined1 (*) [16])mask + mask_stride * 2;
        dst = *(undefined1 (*) [16])dst + dst_stride;
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src0 + uVar2 * 2);
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src1 + (ulong)src1_stride * 2);
        h = h + -1;
      } while (h != 0);
    }
  }
  else if (w == 8) {
    if (0 < h) {
      auVar24._8_2_ = 0x40;
      auVar24._0_8_ = 0x40004000400040;
      auVar24._10_2_ = 0x40;
      auVar24._12_2_ = 0x40;
      auVar24._14_2_ = 0x40;
      do {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)mask;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
        auVar11 = vpaddusb_avx(auVar36,auVar42);
        auVar11 = vpavgb_avx(auVar11,(undefined1  [16])0x0);
        auVar1 = vpmovzxbw_avx(auVar11);
        auVar38 = vpsubw_avx(auVar24,auVar1);
        auVar11 = vpunpcklwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
        auVar41 = vpunpcklwd_avx(auVar1,auVar38);
        auVar11 = vpmaddwd_avx(auVar11,auVar41);
        auVar41 = vpunpckhwd_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
        auVar38 = vpunpckhwd_avx(auVar1,auVar38);
        auVar11 = vpsubd_avx(auVar11,auVar15);
        auVar1 = vpsrad_avx(auVar11,ZEXT416(uVar3));
        auVar11 = vpmaddwd_avx(auVar41,auVar38);
        auVar11 = vpsubd_avx(auVar11,auVar15);
        auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
        auVar11 = vpackssdw_avx(auVar1,auVar11);
        auVar11 = vpackuswb_avx(auVar11,auVar11);
        *(long *)dst = auVar11._0_8_;
        mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
        dst = dst + dst_stride;
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + uVar2 * 2);
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (ulong)src1_stride * 2);
        h = h + -1;
      } while (h != 0);
    }
  }
  else if (w == 4) {
    if (0 < h) {
      auVar22._8_2_ = 0x40;
      auVar22._0_8_ = 0x40004000400040;
      auVar22._10_2_ = 0x40;
      auVar22._12_2_ = 0x40;
      auVar22._14_2_ = 0x40;
      do {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)mask;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
        auVar11 = vpaddusb_avx(auVar35,auVar40);
        auVar11 = vpavgb_avx(auVar11,(undefined1  [16])0x0);
        auVar11 = vpmovzxbw_avx(auVar11);
        auVar1 = vpsubw_avx(auVar22,auVar11);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)src0;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)src1;
        auVar38 = vpunpcklwd_avx(auVar47,auVar51);
        auVar11 = vpunpcklwd_avx(auVar11,auVar1);
        auVar11 = vpmaddwd_avx(auVar38,auVar11);
        auVar11 = vpsubd_avx(auVar11,auVar15);
        auVar11 = vpsrad_avx(auVar11,ZEXT416(uVar3));
        auVar11 = vpackssdw_avx(auVar11,auVar11);
        auVar11 = vpackuswb_avx(auVar11,auVar11);
        *(int *)dst = auVar11._0_4_;
        mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
        dst = dst + dst_stride;
        src0 = (CONV_BUF_TYPE *)((long)src0 + uVar2 * 2);
        src1 = (CONV_BUF_TYPE *)((long)src1 + (ulong)src1_stride * 2);
        h = h + -1;
      } while (h != 0);
    }
  }
  else if (0 < h) {
    puVar8 = mask + mask_stride;
    iVar5 = 0;
    auVar43._8_2_ = 0x40;
    auVar43._0_8_ = 0x40004000400040;
    auVar43._10_2_ = 0x40;
    auVar43._12_2_ = 0x40;
    auVar43._14_2_ = 0x40;
    auVar43._16_2_ = 0x40;
    auVar43._18_2_ = 0x40;
    auVar43._20_2_ = 0x40;
    auVar43._22_2_ = 0x40;
    auVar43._24_2_ = 0x40;
    auVar43._26_2_ = 0x40;
    auVar43._28_2_ = 0x40;
    auVar43._30_2_ = 0x40;
    do {
      if (0 < w) {
        lVar7 = 0;
        do {
          auVar16 = vpaddusb_avx2(*(undefined1 (*) [32])(mask + lVar7),
                                  *(undefined1 (*) [32])(puVar8 + lVar7));
          auVar16 = vpavgb_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar17 = vpmovzxbw_avx2(auVar16._0_16_);
          auVar44 = vpmovzxbw_avx2(auVar16._16_16_);
          auVar27 = vpsubw_avx2(auVar43,auVar17);
          auVar48 = vpsubw_avx2(auVar43,auVar44);
          auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                    *(undefined1 (*) [32])(src1 + lVar7));
          auVar20 = vpunpcklwd_avx2(auVar17,auVar27);
          auVar16 = vpmaddwd_avx2(auVar16,auVar20);
          auVar20 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7),
                                    *(undefined1 (*) [32])(src1 + lVar7));
          auVar17 = vpunpckhwd_avx2(auVar17,auVar27);
          auVar17 = vpmaddwd_avx2(auVar20,auVar17);
          auVar27 = vpunpcklwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                    *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
          auVar20 = vpunpcklwd_avx2(auVar44,auVar48);
          auVar27 = vpmaddwd_avx2(auVar20,auVar27);
          auVar20 = vpunpckhwd_avx2(*(undefined1 (*) [32])(src0 + lVar7 + 0x10),
                                    *(undefined1 (*) [32])(src1 + lVar7 + 0x10));
          auVar44 = vpunpckhwd_avx2(auVar44,auVar48);
          auVar44 = vpmaddwd_avx2(auVar20,auVar44);
          auVar16 = vpsubd_avx2(auVar16,auVar14);
          auVar16 = vpsrad_avx2(auVar16,ZEXT416(uVar3));
          auVar17 = vpsubd_avx2(auVar17,auVar14);
          auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
          auVar16 = vpackssdw_avx2(auVar16,auVar17);
          auVar17 = vpsubd_avx2(auVar27,auVar14);
          auVar17 = vpsrad_avx2(auVar17,ZEXT416(uVar3));
          auVar27 = vpsubd_avx2(auVar44,auVar14);
          auVar27 = vpsrad_avx2(auVar27,ZEXT416(uVar3));
          auVar17 = vpackssdw_avx2(auVar17,auVar27);
          auVar16 = vpackuswb_avx2(auVar16,auVar17);
          auVar16 = vpermq_avx2(auVar16,0xd8);
          *(undefined1 (*) [32])(dst + lVar7) = auVar16;
          lVar7 = lVar7 + 0x20;
        } while (lVar7 < w);
      }
      mask = mask + mask_stride * 2;
      dst = dst + dst_stride;
      iVar5 = iVar5 + 1;
      src1 = src1 + src1_stride;
      src0 = src0 + uVar2;
      puVar8 = puVar8 + mask_stride * 2;
    } while (iVar5 != h);
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  const int round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;

  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;
  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));
  const __m128i v_round_offset = _mm_set1_epi32(round_offset);
  const __m256i y_round_offset = _mm256_set1_epi32(round_offset);

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh0_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh1_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw1_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh0_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw0_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh1_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  }
}